

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<std::complex<float>,_10> * __thiscall
TPZManVector<std::complex<float>,_10>::operator=
          (TPZManVector<std::complex<float>,_10> *this,TPZManVector<std::complex<float>,_10> *copy)

{
  ulong uVar1;
  complex<float> *pcVar2;
  ulong uVar3;
  
  if (this != copy) {
    uVar1 = (copy->super_TPZVec<std::complex<float>_>).fNElements;
    if (((this->super_TPZVec<std::complex<float>_>).fNAlloc < (long)uVar1) &&
       (pcVar2 = (this->super_TPZVec<std::complex<float>_>).fStore,
       pcVar2 != this->fExtAlloc && pcVar2 != (complex<float> *)0x0)) {
      operator_delete__(pcVar2);
      (this->super_TPZVec<std::complex<float>_>).fStore = (complex<float> *)0x0;
      (this->super_TPZVec<std::complex<float>_>).fNAlloc = 0;
    }
    if ((long)uVar1 < 0xb) {
      pcVar2 = (this->super_TPZVec<std::complex<float>_>).fStore;
      if (pcVar2 != (complex<float> *)0x0 && pcVar2 != this->fExtAlloc) {
        operator_delete__(pcVar2);
      }
      (this->super_TPZVec<std::complex<float>_>).fNAlloc = 0;
      (this->super_TPZVec<std::complex<float>_>).fStore = this->fExtAlloc;
    }
    else if ((this->super_TPZVec<std::complex<float>_>).fNAlloc < (long)uVar1) {
      pcVar2 = (complex<float> *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
      memset(pcVar2,0,uVar1 * 8);
      (this->super_TPZVec<std::complex<float>_>).fStore = pcVar2;
      (this->super_TPZVec<std::complex<float>_>).fNAlloc = uVar1;
    }
    (this->super_TPZVec<std::complex<float>_>).fNElements = uVar1;
    if (0 < (long)uVar1) {
      uVar3 = 0;
      do {
        (this->super_TPZVec<std::complex<float>_>).fStore[uVar3]._M_value =
             (copy->super_TPZVec<std::complex<float>_>).fStore[uVar3]._M_value;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}